

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfunc.h
# Opt level: O1

bool rapidjson::internal::CountStringCodePoint<rapidjson::UTF8<char>>
               (Ch *s,SizeType length,SizeType *outCount)

{
  Ch *pCVar1;
  bool bVar2;
  SizeType SVar3;
  uint codepoint;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  uint local_44;
  GenericStringStream<rapidjson::UTF8<char>_> local_40;
  
  if (s == (Ch *)0x0) {
    __assert_fail("s != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                  ,0x41,
                  "bool rapidjson::internal::CountStringCodePoint(const typename Encoding::Ch *, SizeType, SizeType *) [Encoding = rapidjson::UTF8<>]"
                 );
  }
  if (outCount == (SizeType *)0x0) {
    __assert_fail("outCount != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                  ,0x42,
                  "bool rapidjson::internal::CountStringCodePoint(const typename Encoding::Ch *, SizeType, SizeType *) [Encoding = rapidjson::UTF8<>]"
                 );
  }
  SVar3 = 0;
  local_40.src_ = s;
  local_40.head_ = s;
  do {
    pCVar1 = local_40.src_;
    if (s + length <= local_40.src_) {
      *outCount = SVar3;
      break;
    }
    bVar2 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      (&local_40,&local_44);
    SVar3 = SVar3 + 1;
  } while (bVar2);
  return s + length <= pCVar1;
}

Assistant:

bool CountStringCodePoint(const typename Encoding::Ch* s, SizeType length, SizeType* outCount) {
    RAPIDJSON_ASSERT(s != 0);
    RAPIDJSON_ASSERT(outCount != 0);
    GenericStringStream<Encoding> is(s);
    const typename Encoding::Ch* end = s + length;
    SizeType count = 0;
    while (is.src_ < end) {
        unsigned codepoint;
        if (!Encoding::Decode(is, &codepoint))
            return false;
        count++;
    }
    *outCount = count;
    return true;
}